

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.h
# Opt level: O2

int64_t icu_63::CollationBuilder::tempCEFromIndexAndStrength(int32_t index,int32_t strength)

{
  return (long)(strength << 8) + 0x4040000006002000 +
         ((ulong)(index & 0x1fc0) << 0x2a | (ulong)(index & 0xfe000) << 0x2b |
         (ulong)((index & 0x3fU) << 0x18));
}

Assistant:

static inline int64_t tempCEFromIndexAndStrength(int32_t index, int32_t strength) {
        return
            // CE byte offsets, to ensure valid CE bytes, and case bits 11
            INT64_C(0x4040000006002000) +
            // index bits 19..13 -> primary byte 1 = CE bits 63..56 (byte values 40..BF)
            ((int64_t)(index & 0xfe000) << 43) +
            // index bits 12..6 -> primary byte 2 = CE bits 55..48 (byte values 40..BF)
            ((int64_t)(index & 0x1fc0) << 42) +
            // index bits 5..0 -> secondary byte 1 = CE bits 31..24 (byte values 06..45)
            ((index & 0x3f) << 24) +
            // strength bits 1..0 -> tertiary byte 1 = CE bits 13..8 (byte values 20..23)
            (strength << 8);
    }